

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetectorList::clearAllAccounting(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  bool bVar1;
  MemLeakPeriod in_ESI;
  MemoryLeakDetectorList *in_RDI;
  MemoryLeakDetectorNode *prev;
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *local_20;
  MemoryLeakDetectorNode *local_18;
  
  local_18 = in_RDI->head_;
  local_20 = (MemoryLeakDetectorNode *)0x0;
  do {
    while( true ) {
      if (local_18 == (MemoryLeakDetectorNode *)0x0) {
        return;
      }
      bVar1 = isInPeriod(in_RDI,local_18,in_ESI);
      if (bVar1) break;
LAB_0011e5f9:
      local_20 = local_18;
      local_18 = *(MemoryLeakDetectorNode **)(local_18 + 0x38);
    }
    if (local_20 != (MemoryLeakDetectorNode *)0x0) {
      *(undefined8 *)(local_20 + 0x38) = *(undefined8 *)(local_18 + 0x38);
      local_18 = local_20;
      goto LAB_0011e5f9;
    }
    in_RDI->head_ = *(MemoryLeakDetectorNode **)(local_18 + 0x38);
    local_18 = in_RDI->head_;
  } while( true );
}

Assistant:

void MemoryLeakDetectorList::clearAllAccounting(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;

    while (cur) {
        if (isInPeriod(cur, period)) {
            if (prev) {
                prev->next_ = cur->next_;
                cur = prev;
            }
            else {
                head_ = cur->next_;
                cur = head_;
                continue;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
}